

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Hcell * machineAtAddr(Hcell *__return_storage_ptr__,Machine *m,Addr a)

{
  AddrTag AVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  void *extraout_RDX;
  Machine *pMVar4;
  char *in_R8;
  int in_R9D;
  map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  *this;
  key_type local_40;
  key_type local_3c;
  Machine *local_38;
  Machine *m_local;
  int local_28;
  Machine *local_20;
  Addr a_local;
  
  local_28 = (int)a.hix_.hix;
  m_local = a._0_8_;
  pMVar4 = m;
  local_38 = m;
  local_20 = m_local;
  a_local.tag_ = local_28;
  unique0x10000104 = __return_storage_ptr__;
  AVar1 = Addr::tag((Addr *)&local_20);
  if (AVar1 == Reg) {
    this = &m->regval;
    Addr::r((Addr *)&local_20,pMVar4,extraout_RDX,0,in_R8,in_R9D,(int)this);
    pmVar2 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](this,&local_3c);
    Hcell::Hcell(__return_storage_ptr__,pmVar2);
  }
  else {
    if (AVar1 != Heap) {
      __assert_fail("false && \"unreachable\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                    ,0x104,"Hcell machineAtAddr(Machine, Addr)");
    }
    local_40.hix = (int)Addr::hix((Addr *)&local_20);
    pmVar3 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_40);
    Hcell::Hcell(__return_storage_ptr__,pmVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Hcell machineAtAddr(Machine m, Addr a) {
    switch (a.tag()) {
        case AddrTag::Reg:
            return m.regval[a.r()];
        case AddrTag::Heap:
            return m.heap[a.hix()];
    }
    assert(false && "unreachable");
}